

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::TransformationParameter::Clear(TransformationParameter *this)

{
  bool bVar1;
  string *default_value;
  LogMessage *other;
  LogFinisher local_8d [20];
  byte local_79;
  LogMessage local_78;
  TransformationParameter *local_40;
  TransformationParameter *this_local;
  InternalMetadataWithArena *local_30;
  InternalMetadataWithArena *local_28;
  undefined4 local_1c;
  HasBits<1UL> *local_18;
  InternalMetadataWithArena *local_10;
  
  local_40 = this;
  google::protobuf::RepeatedField<float>::Clear(&this->mean_value_);
  bVar1 = has_mean_file(this);
  if (bVar1) {
    default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(&this->mean_file_,default_value);
    local_79 = 0;
    if (bVar1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                 ,0x4653);
      local_79 = 1;
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_78,
                         "CHECK failed: !mean_file_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                        );
      google::protobuf::internal::LogFinisher::operator=(local_8d,other);
    }
    if ((local_79 & 1) != 0) {
      google::protobuf::internal::LogMessage::~LogMessage(&local_78);
    }
    google::protobuf::internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->mean_file_)
    ;
    std::__cxx11::string::clear();
  }
  local_18 = &this->_has_bits_;
  local_1c = 0;
  if ((local_18->has_bits_[0] & 0x3e) != 0) {
    memset(&this->crop_size_,0,7);
    this->scale_ = 1.0;
  }
  this_local = (TransformationParameter *)&this->_has_bits_;
  memset(this_local,0,4);
  local_30 = &this->_internal_metadata_;
  if (((uint)(local_30->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_28 = local_30;
    local_10 = local_30;
    google::protobuf::internal::InternalMetadataWithArena::DoClear(local_30);
  }
  return;
}

Assistant:

void TransformationParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.TransformationParameter)
  mean_value_.Clear();
  if (has_mean_file()) {
    GOOGLE_DCHECK(!mean_file_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
    (*mean_file_.UnsafeRawStringPointer())->clear();
  }
  if (_has_bits_[0 / 32] & 62u) {
    ::memset(&crop_size_, 0, reinterpret_cast<char*>(&force_gray_) -
      reinterpret_cast<char*>(&crop_size_) + sizeof(force_gray_));
    scale_ = 1;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}